

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::internal::MapFieldPrinterHelper::CopyValue
               (MapValueRef *value,Message *message,FieldDescriptor *field_desc)

{
  bool value_00;
  int32_t value_01;
  uint32_t value_02;
  int value_03;
  Message *pMVar1;
  Message *from;
  uint64_t value_04;
  int64_t value_05;
  Reflection *this;
  float value_06;
  double value_07;
  Metadata MVar2;
  allocator<char> local_59;
  string local_58;
  string_view local_38;
  
  MVar2 = Message::GetMetadata(message);
  this = MVar2.reflection;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_desc->type_ * 4)) {
  case 1:
    value_01 = MapValueConstRef::GetInt32Value(&value->super_MapValueConstRef);
    Reflection::SetInt32(this,message,field_desc,value_01);
    return;
  case 2:
    value_05 = MapValueConstRef::GetInt64Value(&value->super_MapValueConstRef);
    Reflection::SetInt64(this,message,field_desc,value_05);
    return;
  case 3:
    value_02 = MapValueConstRef::GetUInt32Value(&value->super_MapValueConstRef);
    Reflection::SetUInt32(this,message,field_desc,value_02);
    return;
  case 4:
    value_04 = MapValueConstRef::GetUInt64Value(&value->super_MapValueConstRef);
    Reflection::SetUInt64(this,message,field_desc,value_04);
    return;
  case 5:
    value_07 = MapValueConstRef::GetDoubleValue(&value->super_MapValueConstRef);
    Reflection::SetDouble(this,message,field_desc,value_07);
    return;
  case 6:
    value_06 = MapValueConstRef::GetFloatValue(&value->super_MapValueConstRef);
    Reflection::SetFloat(this,message,field_desc,value_06);
    return;
  case 7:
    value_00 = MapValueConstRef::GetBoolValue(&value->super_MapValueConstRef);
    Reflection::SetBool(this,message,field_desc,value_00);
    return;
  case 8:
    value_03 = MapValueConstRef::GetEnumValue(&value->super_MapValueConstRef);
    Reflection::SetEnumValue(this,message,field_desc,value_03);
    return;
  case 9:
    local_38 = MapValueConstRef::GetStringValue(&value->super_MapValueConstRef);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_58,&local_38,&local_59);
    Reflection::SetString(this,message,field_desc,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    break;
  case 10:
    pMVar1 = MapValueConstRef::GetMessageValue(&value->super_MapValueConstRef);
    pMVar1 = Message::New(pMVar1);
    from = MapValueConstRef::GetMessageValue(&value->super_MapValueConstRef);
    Message::CopyFrom(pMVar1,from);
    Reflection::SetAllocatedMessage(this,message,pMVar1,field_desc);
    return;
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyValue(const MapValueRef& value,
                                      Message* message,
                                      const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
      reflection->SetDouble(message, field_desc, value.GetDoubleValue());
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      reflection->SetFloat(message, field_desc, value.GetFloatValue());
      return;
    case FieldDescriptor::CPPTYPE_ENUM:
      reflection->SetEnumValue(message, field_desc, value.GetEnumValue());
      return;
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      Message* sub_message = value.GetMessageValue().New();
      sub_message->CopyFrom(value.GetMessageValue());
      reflection->SetAllocatedMessage(message, sub_message, field_desc);
      return;
    }
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc,
                            std::string(value.GetStringValue()));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, value.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, value.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, value.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, value.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, value.GetBoolValue());
      return;
  }
}